

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O0

void __thiscall
adios2::core::VariableBase::CheckRandomAccessConflict(VariableBase *this,string *hint)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_f8 [24];
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string local_b8 [39];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  if (((*(byte *)(in_RDI + 0xd2) & 1) != 0) && ((*(byte *)(in_RDI + 0xd3) & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Core",&local_31);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_69 + 1),"VariableBase",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_91 + 1),"CheckRandomAccessConflict",(allocator *)__rhs);
    std::operator+((char *)in_stack_ffffffffffffff28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void VariableBase::CheckRandomAccessConflict(const std::string hint) const
{
    if (m_RandomAccess && !m_FirstStreamingStep)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckRandomAccessConflict",
                                             "can't mix streaming and "
                                             "random-access (call to SetStepSelection)"
                                             "for variable " +
                                                 m_Name + ", " + hint);
    }
}